

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msghash32,
              secp256k1_pubkey *pubkey)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  secp256k1_ecdsa_signature *in_RSI;
  secp256k1_context *in_RDI;
  secp256k1_scalar m;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ge q;
  uint7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  bool bVar2;
  secp256k1_ge *in_stack_ffffffffffffff20;
  secp256k1_context *in_stack_ffffffffffffff28;
  secp256k1_scalar *in_stack_ffffffffffffff30;
  secp256k1_scalar local_c0;
  secp256k1_scalar local_a0 [4];
  secp256k1_ecdsa_signature *local_18;
  secp256k1_context *local_10;
  uint local_4;
  
  if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff20,
               (char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    local_4 = 0;
  }
  else if (in_RSI == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff20,
               (char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff20,
               (char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffff30,(uchar *)in_stack_ffffffffffffff28,
               (int *)in_stack_ffffffffffffff20);
    secp256k1_ecdsa_signature_load(local_10,local_a0,&local_c0,local_18);
    iVar1 = secp256k1_scalar_is_high((secp256k1_scalar *)in_stack_ffffffffffffff20);
    bVar2 = false;
    if (iVar1 == 0) {
      iVar1 = secp256k1_pubkey_load
                        (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                         (secp256k1_pubkey *)(ulong)in_stack_ffffffffffffff18);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = secp256k1_ecdsa_sig_verify
                          ((secp256k1_scalar *)ctx,(secp256k1_scalar *)sig,(secp256k1_ge *)msghash32
                           ,(secp256k1_scalar *)pubkey);
        bVar2 = iVar1 != 0;
      }
    }
    local_4 = (uint)bVar2;
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msghash32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&r, &s, &q, &m));
}